

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiPhraseFirstColumn(Fts5Context *pCtx,int iPhrase,Fts5PhraseIter *pIter,int *piCol)

{
  long lVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  int iVar5;
  int n;
  int n_1;
  undefined8 local_28;
  
  local_28 = in_RAX;
  if (*(int *)(*(long *)(*(long *)pCtx + 0x18) + 0x5c) == 2) {
    lVar1 = *(long *)(pCtx + 0x48);
    if (lVar1 == 0) {
      iVar4 = sqlite3Fts5ExprPhraseCollist
                        (*(Fts5Expr **)(pCtx + 0x40),iPhrase,&pIter->a,(int *)&local_28);
    }
    else {
      iVar4 = 0;
      iVar5 = 0;
      if (iPhrase != 0) {
        iVar5 = *(int *)(lVar1 + 0x18 + (long)iPhrase * 4);
      }
      local_28._4_4_ = (int)((ulong)in_RAX >> 0x20);
      local_28 = CONCAT44(local_28._4_4_,*(int *)(lVar1 + 0x1c + (long)iPhrase * 4) - iVar5);
      pIter->a = (uchar *)((long)iVar5 + *(long *)(lVar1 + 0x10));
    }
    if (iVar4 == 0) {
      pIter->b = pIter->a + (int)local_28;
      *piCol = 0;
      fts5ApiPhraseNextColumn(pCtx,pIter,piCol);
    }
  }
  else {
    iVar4 = fts5CsrPoslist((Fts5Cursor *)pCtx,iPhrase,&pIter->a,(int *)((long)&local_28 + 4));
    if (iVar4 == 0) {
      puVar2 = pIter->a;
      pIter->b = puVar2 + local_28._4_4_;
      if ((long)local_28._4_4_ < 1) {
        *piCol = -1;
      }
      else if (*puVar2 == '\x01') {
        uVar3 = sqlite3Fts5GetVarint32(puVar2 + 1,(u32 *)piCol);
        pIter->a = pIter->a + (ulong)uVar3 + 1;
      }
      else {
        *piCol = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int fts5ApiPhraseFirstColumn(
  Fts5Context *pCtx, 
  int iPhrase, 
  Fts5PhraseIter *pIter, 
  int *piCol
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;

  if( pConfig->eDetail==FTS5_DETAIL_COLUMNS ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int n;
    if( pSorter ){
      int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
      n = pSorter->aIdx[iPhrase] - i1;
      pIter->a = &pSorter->aPoslist[i1];
    }else{
      rc = sqlite3Fts5ExprPhraseCollist(pCsr->pExpr, iPhrase, &pIter->a, &n);
    }
    if( rc==SQLITE_OK ){
      pIter->b = &pIter->a[n];
      *piCol = 0;
      fts5ApiPhraseNextColumn(pCtx, pIter, piCol);
    }
  }else{
    int n;
    rc = fts5CsrPoslist(pCsr, iPhrase, &pIter->a, &n);
    if( rc==SQLITE_OK ){
      pIter->b = &pIter->a[n];
      if( n<=0 ){
        *piCol = -1;
      }else if( pIter->a[0]==0x01 ){
        pIter->a += 1 + fts5GetVarint32(&pIter->a[1], *piCol);
      }else{
        *piCol = 0;
      }
    }
  }

  return rc;
}